

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

void capnp::_::WireHelpers::setCapabilityPointer
               (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *ref,
               Own<capnp::ClientHook> *cap)

{
  int iVar1;
  uint32_t uVar2;
  undefined4 extraout_var;
  
  if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
    zeroObject(segment,capTable,ref);
  }
  iVar1 = (*cap->ptr->_vptr_ClientHook[5])();
  if ((undefined4 *)CONCAT44(extraout_var,iVar1) == &ClientHook::NULL_CAPABILITY_BRAND) {
    ref->offsetAndKind = 0;
    ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  }
  else {
    uVar2 = (*(capTable->super_CapTableReader)._vptr_CapTableReader[1])(capTable,cap);
    (ref->offsetAndKind).value = 3;
    (ref->field_1).upper32Bits = uVar2;
  }
  return;
}

Assistant:

static void setCapabilityPointer(
      SegmentBuilder* segment, CapTableBuilder* capTable, WirePointer* ref,
      kj::Own<ClientHook>&& cap) {
    if (!ref->isNull()) {
      zeroObject(segment, capTable, ref);
    }
    if (cap->isNull()) {
      zeroMemory(ref);
    } else {
      ref->setCap(capTable->injectCap(kj::mv(cap)));
    }
  }